

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asyn-thread.c
# Opt level: O2

void Curl_resolver_kill(connectdata *conn)

{
  long *plVar1;
  
  plVar1 = (long *)(conn->async).os_specific;
  if ((plVar1 != (long *)0x0) && (*plVar1 != 0)) {
    thread_wait_resolv(conn,(Curl_dns_entry **)0x0,false);
    return;
  }
  destroy_async_data(&conn->async);
  return;
}

Assistant:

void Curl_resolver_kill(struct connectdata *conn)
{
  struct thread_data *td = (struct thread_data*) conn->async.os_specific;

  /* If we're still resolving, we must wait for the threads to fully clean up,
     unfortunately.  Otherwise, we can simply cancel to clean up any resolver
     data. */
  if(td && td->thread_hnd != curl_thread_t_null)
    (void)thread_wait_resolv(conn, NULL, FALSE);
  else
    Curl_resolver_cancel(conn);
}